

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

bool __thiscall flow::lang::Lexer::ipv6HexDigit4(Lexer *this)

{
  bool bVar1;
  ulong uVar2;
  
  uVar2 = this->ipv6HexDigits_ - 1;
  while( true ) {
    bVar1 = isHexChar(this);
    if (!bVar1) break;
    std::__cxx11::string::push_back((char)this + -0x58);
    nextChar(this,true);
    uVar2 = uVar2 + 1;
  }
  this->ipv6HexDigits_ = 0;
  return uVar2 < 4;
}

Assistant:

bool Lexer::ipv6HexDigit4() {
  size_t i = ipv6HexDigits_;

  while (isHexChar()) {
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
    ++i;
  }

  ipv6HexDigits_ = 0;

  return i >= 1 && i <= 4;
}